

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SS.h
# Opt level: O1

int __thiscall SS<4U>::Query(SS<4U> *this,Data<4U> *item)

{
  int iVar1;
  iterator iVar2;
  mapped_type *ppSVar3;
  CounterMap *this_00;
  
  this_00 = &this->summary->mp;
  iVar2 = std::
          _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,item);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    iVar1 = 0;
  }
  else {
    ppSVar3 = std::__detail::
              _Map_base<Data<4U>,_std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,item);
    iVar1 = ((*ppSVar3)->parent->super_Node<int>).ID;
  }
  return iVar1;
}

Assistant:

int Query(const Data<DATA_LEN>& item) { return summary->Query(item); }